

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O3

void __thiscall Shell::FunctionDefinition::~FunctionDefinition(FunctionDefinition *this)

{
  uint uVar1;
  Entry *pEVar2;
  Def *this_00;
  Def **ppDVar3;
  ulong uVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  
  pEVar5 = (this->_defs)._entries;
  pEVar2 = (this->_defs)._afterLast;
  if (pEVar5 != pEVar2) {
    uVar1 = (this->_defs)._timestamp;
    do {
      pEVar6 = pEVar5 + 1;
      if (((pEVar5->field_0)._infoData & 1U) == 0 && (uint)(pEVar5->field_0)._infoData >> 2 == uVar1
         ) {
        this_00 = pEVar5->_val;
        if (this_00 != (Def *)0x0) {
          Def::~Def(this_00);
        }
        operator_delete(this_00,0x40);
      }
      pEVar5 = pEVar6;
    } while (pEVar6 != pEVar2);
  }
  Lib::Array<int>::~Array((Array<int> *)&this->_counter);
  ppDVar3 = (this->_safeDefs)._stack;
  if (ppDVar3 != (Def **)0x0) {
    uVar4 = (this->_safeDefs)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppDVar3;
    }
    else if (uVar4 < 0x11) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppDVar3;
    }
    else if (uVar4 < 0x19) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppDVar3;
    }
    else if (uVar4 < 0x21) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppDVar3;
    }
    else if (uVar4 < 0x31) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppDVar3;
    }
    else if (uVar4 < 0x41) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppDVar3;
    }
    else {
      operator_delete(ppDVar3,0x10);
    }
  }
  ppDVar3 = (this->_blockedDefs)._stack;
  if (ppDVar3 != (Def **)0x0) {
    uVar4 = (this->_blockedDefs)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppDVar3;
    }
    else if (uVar4 < 0x11) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppDVar3;
    }
    else if (uVar4 < 0x19) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppDVar3;
    }
    else if (uVar4 < 0x21) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppDVar3;
    }
    else if (uVar4 < 0x31) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppDVar3;
    }
    else if (uVar4 < 0x41) {
      *ppDVar3 = (Def *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppDVar3;
    }
    else {
      operator_delete(ppDVar3,0x10);
    }
  }
  Lib::DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
            (&this->_defs);
  return;
}

Assistant:

FunctionDefinition::~FunctionDefinition ()
{
  Fn2DefMap::Iterator dit(_defs);
  while(dit.hasNext()) {
    delete dit.next();
  }
}